

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessCommDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  Value *pVVar4;
  element_type *peVar5;
  CommissionerDataset *aDataset;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  anon_class_1_0_00000001 local_71a;
  v10 local_719;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_718;
  char *local_710;
  string local_708;
  Error local_6e8;
  Value local_6c0;
  ErrorCode local_674;
  Error local_670;
  Value local_648;
  ErrorCode local_5fc;
  Error local_5f8;
  Value local_5d0;
  anon_class_1_0_00000001 local_582;
  v10 local_581;
  v10 *local_580;
  size_t local_578;
  string local_570;
  Error local_550;
  Value local_528;
  undefined1 local_4e0 [8];
  CommissionerDataset dataset_1;
  string local_480;
  int local_45c;
  string local_458;
  Value local_438;
  ErrorCode local_3ec;
  Error local_3e8;
  Value local_3c0;
  undefined1 local_378 [8];
  CommissionerDataset dataset;
  string local_318;
  anon_class_1_0_00000001 local_2e2;
  v10 local_2e1;
  v10 *local_2e0;
  size_t local_2d8;
  string local_2d0;
  Error local_2b0;
  Value local_288;
  byte local_239;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_238;
  Expression *aExpr_local;
  CommissionerAppPtr *aCommissioner_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [3];
  undefined1 local_1b0 [16];
  v10 *local_1a0;
  ulong local_198;
  v10 *local_190;
  size_t sStack_188;
  string *local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_178 [3];
  undefined1 local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  char *local_148;
  const_reference local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *pcStack_130;
  string *local_128;
  v10 *local_120;
  v10 **local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  v10 **local_d0;
  v10 *local_c8;
  size_t sStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  undefined1 *local_a8;
  Value **local_a0;
  undefined1 *local_98;
  Value **local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_88;
  Value **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  local_239 = 0;
  local_238 = aExpr;
  aExpr_local = (Expression *)aCommissioner;
  aCommissioner_local = (CommissionerAppPtr *)this;
  this_local = (Interpreter *)__return_storage_ptr__;
  Value::Value(__return_storage_ptr__);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_238);
  if (sVar2 < 2) {
    ProcessCommDatasetJob::anon_class_1_0_00000001::operator()(&local_2e2);
    local_118 = &local_2e0;
    local_120 = &local_2e1;
    bVar6 = ::fmt::v10::operator()(local_120);
    local_2d8 = bVar6.size_;
    local_2e0 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_180 = &local_2d0;
    local_190 = local_2e0;
    sStack_188 = local_2d8;
    local_f0 = &local_190;
    local_1a0 = local_2e0;
    local_198 = local_2d8;
    local_e8 = local_1a0;
    sStack_e0 = local_198;
    local_1c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_a8 = local_1b0;
    local_b0 = local_1c8;
    local_60 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_198;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_b0;
    local_88 = local_b0;
    local_68 = local_b0;
    local_58 = local_a8;
    ::fmt::v10::vformat_abi_cxx11_(&local_2d0,local_1a0,fmt,args);
    Error::Error(&local_2b0,kInvalidArgs,&local_2d0);
    Value::Value(&local_288,&local_2b0);
    Value::operator=(__return_storage_ptr__,&local_288);
    Value::~Value(&local_288);
    Error::~Error(&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_238,1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_318,"get",(allocator *)((long)&dataset.mPresentFlags + 1));
    bVar1 = CaseInsensitiveEqual(pvVar3,&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dataset.mPresentFlags + 1));
    if (bVar1) {
      CommissionerDataset::CommissionerDataset((CommissionerDataset *)local_378);
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)aExpr_local);
      (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x1b])
                (&local_3e8,peVar5,local_378,0xffff);
      Value::Value(&local_3c0,&local_3e8);
      pVVar4 = Value::operator=(__return_storage_ptr__,&local_3c0);
      local_3ec = kNone;
      bVar1 = Value::operator!=(pVVar4,&local_3ec);
      Value::~Value(&local_3c0);
      Error::~Error(&local_3e8);
      if (bVar1) {
        local_45c = 4;
      }
      else {
        CommissionerDatasetToJson_abi_cxx11_(&local_458,(commissioner *)local_378,aDataset);
        Value::Value(&local_438,&local_458);
        Value::operator=(__return_storage_ptr__,&local_438);
        Value::~Value(&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        local_45c = 0;
      }
      CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_378);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](local_238,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_480,"set",(allocator *)((long)&dataset_1.mPresentFlags + 1));
      bVar1 = CaseInsensitiveEqual(pvVar3,&local_480);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator((allocator<char> *)((long)&dataset_1.mPresentFlags + 1));
      if (!bVar1) {
        ProcessCommDatasetJob::anon_class_1_0_00000001::operator()(&local_71a);
        local_f8 = &local_718;
        local_100 = &local_719;
        bVar6 = ::fmt::v10::operator()(local_100);
        local_710 = (char *)bVar6.size_;
        local_718 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar6.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        local_140 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_238,1);
        local_128 = &local_708;
        local_138 = local_718;
        pcStack_130 = local_710;
        local_50 = &local_138;
        local_150 = local_718;
        local_148 = local_710;
        local_48 = local_150;
        pcStack_40 = local_148;
        local_178[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                 ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_140,(v10 *)local_128,local_718);
        local_30 = local_160;
        local_38 = local_178;
        local_20 = 0xd;
        fmt_01.size_ = 0xd;
        fmt_01.data_ = local_148;
        args_01.field_1.values_ = in_R9.values_;
        args_01.desc_ = (unsigned_long_long)local_38;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        ::fmt::v10::vformat_abi_cxx11_(&local_708,(v10 *)local_150,fmt_01,args_01);
        Error::Error(&local_6e8,kInvalidCommand,&local_708);
        Value::Value(&local_6c0,&local_6e8);
        Value::operator=(__return_storage_ptr__,&local_6c0);
        Value::~Value(&local_6c0);
        Error::~Error(&local_6e8);
        std::__cxx11::string::~string((string *)&local_708);
        goto LAB_0031832d;
      }
      CommissionerDataset::CommissionerDataset((CommissionerDataset *)local_4e0);
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(local_238);
      if (sVar2 < 3) {
        ProcessCommDatasetJob::anon_class_1_0_00000001::operator()(&local_582);
        local_108 = &local_580;
        local_110 = &local_581;
        bVar6 = ::fmt::v10::operator()(local_110);
        local_578 = bVar6.size_;
        local_580 = (v10 *)bVar6.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_1d0 = &local_570;
        local_1e0 = local_580;
        sStack_1d8 = local_578;
        local_d0 = &local_1e0;
        local_1f0 = local_580;
        local_1e8 = local_578;
        local_c8 = local_1f0;
        sStack_c0 = local_1e8;
        value = (Value *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>()
        ;
        local_98 = local_200;
        local_a0 = &value;
        local_78 = 0;
        fmt_00.size_ = 0;
        fmt_00.data_ = (char *)local_1e8;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_a0;
        local_90 = local_a0;
        local_80 = local_a0;
        local_70 = local_98;
        ::fmt::v10::vformat_abi_cxx11_(&local_570,local_1f0,fmt_00,args_00);
        Error::Error(&local_550,kInvalidArgs,&local_570);
        Value::Value(&local_528,&local_550);
        Value::operator=(__return_storage_ptr__,&local_528);
        Value::~Value(&local_528);
        Error::~Error(&local_550);
        std::__cxx11::string::~string((string *)&local_570);
        local_45c = 4;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_238,2);
        CommissionerDatasetFromJson(&local_5f8,(CommissionerDataset *)local_4e0,pvVar3);
        Value::Value(&local_5d0,&local_5f8);
        pVVar4 = Value::operator=(__return_storage_ptr__,&local_5d0);
        local_5fc = kNone;
        bVar1 = Value::operator!=(pVVar4,&local_5fc);
        Value::~Value(&local_5d0);
        Error::~Error(&local_5f8);
        if (bVar1) {
          local_45c = 4;
        }
        else {
          peVar5 = std::
                   __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)aExpr_local);
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x1c])
                    (&local_670,peVar5,local_4e0);
          Value::Value(&local_648,&local_670);
          pVVar4 = Value::operator=(__return_storage_ptr__,&local_648);
          local_674 = kNone;
          bVar1 = Value::operator!=(pVVar4,&local_674);
          Value::~Value(&local_648);
          Error::~Error(&local_670);
          if (bVar1) {
            local_45c = 4;
          }
          else {
            local_45c = 0;
          }
        }
      }
      CommissionerDataset::~CommissionerDataset((CommissionerDataset *)local_4e0);
    }
    if ((local_45c != 0) && (local_45c != 4)) goto LAB_0031833e;
  }
LAB_0031832d:
  local_239 = 1;
  local_45c = 1;
LAB_0031833e:
  if ((local_239 & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessCommDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        CommissionerDataset dataset;
        SuccessOrExit(value = aCommissioner->GetCommissionerDataset(dataset, 0xFFFF));
        value = CommissionerDatasetToJson(dataset);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        CommissionerDataset dataset;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = CommissionerDatasetFromJson(dataset, aExpr[2]));
        SuccessOrExit(value = aCommissioner->SetCommissionerDataset(dataset));
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}